

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_unique_ptr.cpp
# Opt level: O0

void __thiscall TestA::TestA(TestA *this)

{
  ostream *this_00;
  TestA *this_local;
  
  std::shared_ptr<TestB>::shared_ptr(&this->m_TestB_Ptr);
  this_00 = std::operator<<((ostream *)&std::cout,"TestA()");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

TestA()
	{
		std::cout << "TestA()" << std::endl;
	}